

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void * __thiscall Js::FunctionProxy::GetAuxPtrWithLock(FunctionProxy *this,AuxPointerType e)

{
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *pAVar1;
  long lVar2;
  CriticalSection *this_00;
  void *pvVar3;
  uint8 u;
  
  if ((this->auxPtrs).ptr == (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
    return (void *)0x0;
  }
  this_00 = &this->m_scriptContext->threadContext->csFunctionBody;
  CCLock::Enter(&this_00->super_CCLock);
  pAVar1 = (this->auxPtrs).ptr;
  if (pAVar1->count == '\x03') {
    lVar2 = 1;
    pvVar3 = (void *)0x0;
    do {
      if (pAVar1->offsets[lVar2 + -2] == e) {
        pvVar3 = *(void **)(pAVar1->offsets + lVar2 * 8 + -2);
        break;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  else {
    if (pAVar1->count == '\x01') {
      if (pAVar1->capacity == e) {
        pvVar3 = *(void **)(pAVar1->offsets + 6);
        goto LAB_007592d0;
      }
    }
    else if ((ulong)pAVar1->offsets[e] != 0xff) {
      pvVar3 = pAVar1->ptrs[pAVar1->offsets[e]].ptr;
      goto LAB_007592d0;
    }
    pvVar3 = (void *)0x0;
  }
LAB_007592d0:
  CCLock::Leave(&this_00->super_CCLock);
  return pvVar3;
}

Assistant:

void* FunctionProxy::GetAuxPtrWithLock(AuxPointerType e) const
    {
        if (this->auxPtrs == nullptr)
        {
            return nullptr;
        }

#if DBG && ENABLE_NATIVE_CODEGEN && defined(_WIN32)
        // the lock for work item queue should not be locked while accessing AuxPtrs in background thread
        auto jobProcessor = this->GetScriptContext()->GetThreadContext()->GetJobProcessor();
        auto jobProcessorCS = jobProcessor->GetCriticalSection();

        // ->IsLocked is not supported on xplat
        Assert(!jobProcessorCS || !jobProcessor->ProcessesInBackground() || !jobProcessorCS->IsLocked());
#endif

        AutoCriticalSection autoCS(this->GetScriptContext()->GetThreadContext()->GetFunctionBodyLock());
        return AuxPtrsT::GetAuxPtr(this, e);
    }